

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

void __thiscall glslang::HlslParseContext::removeUnusedStructBufferCounters(HlslParseContext *this)

{
  __normal_iterator<glslang::TSymbol_**,_std::vector<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>_>
  local_48;
  const_iterator local_40;
  const_iterator local_38;
  HlslParseContext *local_30;
  TSymbol **local_28;
  __normal_iterator<glslang::TSymbol_**,_std::vector<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>_>
  local_20;
  __normal_iterator<glslang::TSymbol_**,_std::vector<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>_>
  local_18;
  __normal_iterator<glslang::TSymbol_**,_std::vector<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>_>
  endIt;
  HlslParseContext *this_local;
  
  endIt._M_current = (TSymbol **)this;
  local_20._M_current =
       (TSymbol **)
       std::vector<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>::begin
                 (&(this->super_TParseContextBase).linkageSymbols.
                   super_vector<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>);
  local_28 = (TSymbol **)
             std::vector<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>::end
                       (&(this->super_TParseContextBase).linkageSymbols.
                         super_vector<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>
                       );
  local_30 = this;
  local_18 = std::
             remove_if<__gnu_cxx::__normal_iterator<glslang::TSymbol**,std::vector<glslang::TSymbol*,glslang::pool_allocator<glslang::TSymbol*>>>,glslang::HlslParseContext::removeUnusedStructBufferCounters()::__0>
                       (local_20,(__normal_iterator<glslang::TSymbol_**,_std::vector<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>_>
                                  )local_28,(anon_class_8_1_8991fb9c_for__M_pred)this);
  __gnu_cxx::
  __normal_iterator<glslang::TSymbol*const*,std::vector<glslang::TSymbol*,glslang::pool_allocator<glslang::TSymbol*>>>
  ::__normal_iterator<glslang::TSymbol**>
            ((__normal_iterator<glslang::TSymbol*const*,std::vector<glslang::TSymbol*,glslang::pool_allocator<glslang::TSymbol*>>>
              *)&local_38,&local_18);
  local_48._M_current =
       (TSymbol **)
       std::vector<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>::end
                 (&(this->super_TParseContextBase).linkageSymbols.
                   super_vector<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>);
  __gnu_cxx::
  __normal_iterator<glslang::TSymbol*const*,std::vector<glslang::TSymbol*,glslang::pool_allocator<glslang::TSymbol*>>>
  ::__normal_iterator<glslang::TSymbol**>
            ((__normal_iterator<glslang::TSymbol*const*,std::vector<glslang::TSymbol*,glslang::pool_allocator<glslang::TSymbol*>>>
              *)&local_40,&local_48);
  std::vector<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>::erase
            (&(this->super_TParseContextBase).linkageSymbols.
              super_vector<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>,
             local_38,local_40);
  return;
}

Assistant:

void HlslParseContext::removeUnusedStructBufferCounters()
{
    const auto endIt = std::remove_if(linkageSymbols.begin(), linkageSymbols.end(),
                                      [this](const TSymbol* sym) {
                                          const auto sbcIt = structBufferCounter.find(sym->getName());
                                          return sbcIt != structBufferCounter.end() && !sbcIt->second;
                                      });

    linkageSymbols.erase(endIt, linkageSymbols.end());
}